

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
Imf_2_5::CompositeDeepScanLine::readPixels(CompositeDeepScanLine *this,int start,int end)

{
  value_type vVar1;
  size_type sVar2;
  size_type sVar3;
  reference ppDVar4;
  Header *pHVar5;
  reference ppHVar6;
  DeepScanLineInputFile *pDVar7;
  long lVar8;
  ulong uVar9;
  reference pvVar10;
  reference pvVar11;
  reference this_00;
  reference pvVar12;
  reference this_01;
  reference this_02;
  reference ppfVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *total_sizes_00;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *pvVar14;
  value_type pcVar15;
  reference ppcVar16;
  TaskGroup *group;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int y;
  TaskGroup g;
  size_t i_4;
  DeepFrameBuffer *in_stack_00000180;
  vector<const_char_*,_std::allocator<const_char_*>_> names;
  size_t j_3;
  size_t i_3;
  size_t part;
  size_t pixel;
  size_t offset;
  size_t channel_1;
  size_t channel;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  samples;
  size_t j_2;
  size_t ptr;
  size_t overall_sample_count;
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_sources;
  vector<unsigned_int,_std::allocator<unsigned_int>_> total_sizes;
  size_t total_pixels;
  size_t total_width;
  size_t j_1;
  size_t i_2;
  size_t i_1;
  size_t j;
  size_t i;
  vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_> headers;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  pointers;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  counts;
  vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_> framebuffers;
  size_t parts;
  DeepFrameBuffer *in_stack_fffffffffffffcc8;
  undefined4 uVar17;
  DeepScanLineInputPart *in_stack_fffffffffffffcd0;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffcd8;
  Data *in_stack_fffffffffffffce0;
  size_type in_stack_fffffffffffffce8;
  LineCompositeTask *in_stack_fffffffffffffcf0;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *pointers_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *num_sources_00;
  int local_1cc;
  TaskGroup local_1c8 [8];
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *local_1c0;
  undefined1 local_1b1 [25];
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  undefined8 in_stack_fffffffffffffe88;
  Header *in_stack_fffffffffffffe90;
  ulong uVar18;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  *in_stack_fffffffffffffe98;
  ulong uVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffea0;
  DeepFrameBuffer *in_stack_fffffffffffffea8;
  Data *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  size_type local_138;
  ulong local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  DeepScanLineInputFile *in_stack_ffffffffffffff00;
  int local_e0;
  DeepScanLineInputFile *pDVar20;
  DeepScanLineInputFile *this_03;
  ulong local_c8;
  size_type local_c0;
  ulong local_b8;
  ulong local_b0;
  vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_> local_a0;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  local_80;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_60 [2];
  vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_> local_30;
  ulong local_18;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  sVar2 = std::
          vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
          ::size(*(vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                   **)(in_RDI + 8));
  sVar3 = std::
          vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
          ::size((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18));
  local_18 = sVar2 + sVar3;
  std::allocator<Imf_2_5::DeepFrameBuffer>::allocator
            ((allocator<Imf_2_5::DeepFrameBuffer> *)0xadaf11);
  std::vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>::vector
            ((vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_> *)
             in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             (allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<Imf_2_5::DeepFrameBuffer>::~allocator
            ((allocator<Imf_2_5::DeepFrameBuffer> *)0xadaf3d);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0xadaf62);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
           (allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0xadaf8e);
  std::
  allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>
               *)0xadafb3);
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
            *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
           (allocator_type *)in_stack_fffffffffffffce0);
  std::
  allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>
                *)0xadafdf);
  std::allocator<const_Imf_2_5::Header_*>::allocator((allocator<const_Imf_2_5::Header_*> *)0xadb004)
  ;
  std::vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>::vector
            ((vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_> *)
             in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             (allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<const_Imf_2_5::Header_*>::~allocator
            ((allocator<const_Imf_2_5::Header_*> *)0xadb030);
  for (local_b0 = 0;
      sVar2 = std::
              vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
              ::size(*(vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                       **)(in_RDI + 8)), local_b0 < sVar2; local_b0 = local_b0 + 1) {
    ppDVar4 = std::
              vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
              ::operator[](*(vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                             **)(in_RDI + 8),local_b0);
    pHVar5 = DeepScanLineInputFile::header(*ppDVar4);
    ppHVar6 = std::vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>::
              operator[](&local_a0,local_b0);
    *ppHVar6 = pHVar5;
  }
  for (local_b8 = 0;
      sVar2 = std::
              vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
              ::size((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                      *)(*(long *)(in_RDI + 8) + 0x18)), local_b8 < sVar2; local_b8 = local_b8 + 1)
  {
    std::vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
    ::operator[]((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18),local_b8);
    pHVar5 = DeepScanLineInputPart::header((DeepScanLineInputPart *)0xadb1ec);
    ppHVar6 = std::vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>::
              operator[](&local_a0,local_b0 + local_b8);
    *ppHVar6 = pHVar5;
  }
  for (local_c0 = 0; local_c0 < local_18; local_c0 = local_c0 + 1) {
    std::vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>::operator[]
              (&local_30,local_c0);
    uVar17 = (undefined4)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[](local_60,local_c0);
    std::
    vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
    ::operator[](&local_80,local_c0);
    std::vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>::operator[]
              (&local_a0,local_c0);
    in_stack_fffffffffffffcc8 = (DeepFrameBuffer *)CONCAT44(uVar17,local_10);
    Data::handleDeepFrameBuffer
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffec0);
  }
  for (local_c8 = 0;
      sVar2 = std::
              vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
              ::size(*(vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                       **)(in_RDI + 8)), local_c8 < sVar2; local_c8 = local_c8 + 1) {
    std::vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
    ::operator[](*(vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                   **)(in_RDI + 8),local_c8);
    std::vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>::operator[]
              (&local_30,local_c8);
    DeepScanLineInputFile::setFrameBuffer
              ((DeepScanLineInputFile *)
               names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start,in_stack_00000180);
    std::vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
    ::operator[](*(vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                   **)(in_RDI + 8),local_c8);
    DeepScanLineInputFile::readPixelSampleCounts
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  }
  pDVar20 = (DeepScanLineInputFile *)0x0;
  while (this_03 = pDVar20,
        pDVar7 = (DeepScanLineInputFile *)
                 std::
                 vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                 ::size((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                         *)(*(long *)(in_RDI + 8) + 0x18)), pDVar20 < pDVar7) {
    std::vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
    ::operator[]((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18),(size_type)this_03);
    std::vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>::operator[]
              (&local_30,(long)&(this_03->super_GenericInputFile)._vptr_GenericInputFile + local_c8)
    ;
    DeepScanLineInputPart::setFrameBuffer(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    std::vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
    ::operator[]((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18),(size_type)this_03);
    DeepScanLineInputPart::readPixelSampleCounts
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (int)in_stack_fffffffffffffcc8);
    pDVar20 = (DeepScanLineInputFile *)
              ((long)&(this_03->super_GenericInputFile)._vptr_GenericInputFile + 1);
  }
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size(in_stack_fffffffffffffcd8);
  lVar8 = (long)(local_e0 + 1);
  uVar9 = lVar8 * ((local_10 - local_c) + 1);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xadb58a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8,(allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xadb5b6);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xadb5db);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8,(allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xadb607);
  local_130 = 0;
  for (local_138 = 0; local_138 < uVar9; local_138 = local_138 + 1) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &stack0xffffffffffffff00,local_138);
    *pvVar10 = 0;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&local_120,local_138);
    *pvVar10 = 0;
    for (sVar2 = 0; sVar2 < local_18; sVar2 = sVar2 + 1) {
      pvVar11 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](local_60,sVar2);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar11,local_138);
      vVar1 = *pvVar10;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &stack0xffffffffffffff00,local_138);
      *pvVar10 = vVar1 + *pvVar10;
      pvVar11 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](local_60,sVar2);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar11,local_138);
      if (*pvVar10 != 0) {
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_120,local_138);
        *pvVar10 = *pvVar10 + 1;
      }
    }
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &stack0xffffffffffffff00,local_138);
    local_130 = *pvVar10 + local_130;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(*(long *)(in_RDI + 8) + 0xb0));
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0xadb7ff);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
           (allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0xadb82b);
  uVar19 = 0;
  while (uVar18 = uVar19,
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(*(long *)(in_RDI + 8) + 0xb0)), uVar19 < sVar2) {
    if ((uVar18 != 1) || ((*(byte *)(*(long *)(in_RDI + 8) + 0x60) & 1) != 0)) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)&stack0xfffffffffffffea8,uVar18);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcf0,
                 in_stack_fffffffffffffce8);
    }
    uVar19 = uVar18 + 1;
  }
  uVar19 = 0;
  while (uVar18 = uVar19,
        sVar2 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        *)&stack0xfffffffffffffea8), uVar19 < sVar2) {
    if ((uVar18 != 1) || ((*(byte *)(*(long *)(in_RDI + 8) + 0x60) & 1) != 0)) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)&stack0xfffffffffffffea8,uVar18);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcf0,
                 in_stack_fffffffffffffce8);
      uVar19 = 0;
      for (local_180 = 0; local_180 < uVar9; local_180 = local_180 + 1) {
        for (local_188 = 0; local_188 < local_18 && uVar19 < local_130; local_188 = local_188 + 1) {
          this_00 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  *)&stack0xfffffffffffffea8,uVar18);
          pvVar12 = std::vector<float,_std::allocator<float>_>::operator[](this_00,uVar19);
          this_01 = std::
                    vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                    ::operator[](&local_80,local_188);
          this_02 = std::
                    vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                    ::operator[](this_01,uVar18);
          ppfVar13 = std::vector<float_*,_std::allocator<float_*>_>::operator[](this_02,local_180);
          *ppfVar13 = pvVar12;
          pvVar11 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[](local_60,local_188);
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar11,local_180);
          uVar19 = *pvVar10 + uVar19;
        }
      }
    }
    uVar19 = uVar18 + 1;
  }
  for (local_190 = 0; uVar9 = local_190,
      sVar2 = std::
              vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
              ::size(*(vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                       **)(in_RDI + 8)), uVar9 < sVar2; local_190 = local_190 + 1) {
    std::vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
    ::operator[](*(vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                   **)(in_RDI + 8),local_190);
    DeepScanLineInputFile::readPixels(this_03,(int)((ulong)lVar8 >> 0x20),(int)lVar8);
  }
  for (local_198 = 0; uVar9 = local_198,
      sVar2 = std::
              vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
              ::size((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                      *)(*(long *)(in_RDI + 8) + 0x18)), uVar9 < sVar2; local_198 = local_198 + 1) {
    std::vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
    ::operator[]((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18),local_198);
    DeepScanLineInputPart::readPixels
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (int)in_stack_fffffffffffffcc8);
  }
  total_sizes_00 =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(*(long *)(in_RDI + 8) + 0xb0));
  num_sources_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b1;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0xadbc28);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8,(allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0xadbc4e);
  local_1c0 = (vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
               *)0x0;
  while (pointers_00 = local_1c0,
        pvVar14 = (vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                   *)std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                               ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                (local_1b1 + 1)), pointers_00 < pvVar14) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(*(long *)(in_RDI + 8) + 0xb0),(size_type)local_1c0);
    pcVar15 = (value_type)std::__cxx11::string::c_str();
    ppcVar16 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_1b1 + 1),
                          (size_type)local_1c0);
    *ppcVar16 = pcVar15;
    local_1c0 = (vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                 *)((long)&(local_1c0->
                           super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x60) & 1) == 0) {
    ppcVar16 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_1b1 + 1),0);
    in_stack_fffffffffffffcf0 = (LineCompositeTask *)*ppcVar16;
    ppcVar16 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_1b1 + 1),1);
    *ppcVar16 = (value_type)in_stack_fffffffffffffcf0;
  }
  IlmThread_2_5::TaskGroup::TaskGroup(local_1c8);
  for (local_1cc = local_c; local_1cc <= local_10; local_1cc = local_1cc + 1) {
    group = (TaskGroup *)operator_new(0x40);
    anon_unknown_15::LineCompositeTask::LineCompositeTask
              (in_stack_fffffffffffffcf0,group,in_stack_fffffffffffffce0,
               (int)((ulong)&local_120 >> 0x20),(int)&local_120,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffff00,
               pointers_00,total_sizes_00,num_sources_00);
    IlmThread_2_5::ThreadPool::addGlobalTask((Task *)group);
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(local_1c8);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffce0);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)in_stack_fffffffffffffce0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffce0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffce0);
  std::vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>::~vector
            ((vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_> *)
             in_stack_fffffffffffffce0);
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
             *)in_stack_fffffffffffffce0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_stack_fffffffffffffce0);
  std::vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>::~vector
            ((vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_> *)
             in_stack_fffffffffffffce0);
  return;
}

Assistant:

void
CompositeDeepScanLine::readPixels(int start, int end)
{
   size_t parts = _Data->_file.size() + _Data->_part.size(); // total of files+parts
   
   vector<DeepFrameBuffer> framebuffers(parts);
   vector< vector<unsigned int> > counts(parts);
   
   //
   // for each part, a pointer to an array of channels
   //
   vector<vector< vector<float *> > > pointers(parts);
   vector<const Header *> headers(parts);
   
   {
     size_t i;
     for(i=0;i<_Data->_file.size();i++)
     {
         headers[i] = &_Data->_file[i]->header();
     }
     
     for(size_t j=0;j<_Data->_part.size();j++)
     {
        headers[i+j] = &_Data->_part[j]->header();
     }
   }
   
   
   for(size_t i=0;i<parts;i++)
   {
     _Data->handleDeepFrameBuffer(framebuffers[i],counts[i],pointers[i],*headers[i],start,end);
   }
   
   //
   // set frame buffers and read scanlines from all parts
   // TODO what happens if SCANLINE not in data window?
   //
   
   {
       size_t i=0;
       for(i=0;i<_Data->_file.size();i++)
       {
            _Data->_file[i]->setFrameBuffer(framebuffers[i]);
            _Data->_file[i]->readPixelSampleCounts(start,end);
       }
       for(size_t j=0;j<_Data->_part.size();j++)
       {
           _Data->_part[j]->setFrameBuffer(framebuffers[i+j]);
           _Data->_part[j]->readPixelSampleCounts(start,end); 
       }
   }   
   
   
   //
   //  total width
   //
   
   size_t total_width = _Data->_dataWindow.size().x+1;
   size_t total_pixels = total_width*(end-start+1);
   vector<unsigned int> total_sizes(total_pixels);
   vector<unsigned int> num_sources(total_pixels); //number of parts with non-zero sample count
   
   size_t overall_sample_count=0; // sum of all samples in all images between start and end
   
   
   //
   // accumulate pixel counts
   //
   for(size_t ptr=0;ptr<total_pixels;ptr++)
   {
       total_sizes[ptr]=0;
       num_sources[ptr]=0;
       for(size_t j=0;j<parts;j++)
       {
          total_sizes[ptr]+=counts[j][ptr];
          if(counts[j][ptr]>0) num_sources[ptr]++;
       }
       overall_sample_count+=total_sizes[ptr];
       
       
       
   }
   
  
  
   
   //
   // allocate arrays for pixel data
   // samples array accessed as in pixels[channel][sample]
   //
   
   vector<vector<float> > samples( _Data->_channels.size() );
   
   for(size_t channel=0;channel<_Data->_channels.size();channel++)
   {
       if( channel!=1 || _Data->_zback)
       {            
           samples[channel].resize(overall_sample_count);
       }
   }
   
   for(size_t channel=0;channel<samples.size();channel++)
   {
       
       if( channel!=1 || _Data->_zback)
       {
           
           samples[channel].resize(overall_sample_count);
       
       
          //
          // allocate pointers for channel data
          //
          
          size_t offset=0;
       
          for(size_t pixel=0;pixel<total_pixels;pixel++)
          {
              for(size_t part=0 ; part<parts && offset<overall_sample_count ; part++ )
              {
                      pointers[part][channel][pixel]=&samples[channel][offset];           
                      offset+=counts[part][pixel];
              }
          }
       
       }
   }
   
   //
   // read data
   //
   
   for(size_t i=0;i<_Data->_file.size();i++)
   {
       _Data->_file[i]->readPixels(start,end);
   }
   for(size_t j=0;j<_Data->_part.size();j++)
   {
       _Data->_part[j]->readPixels(start,end); 
   }
   
   
   
   
   //
   // composite pixels and write back to framebuffer
  //
   
   
   // turn vector of strings into array of char *
   // and make sure 'ZBack' channel is correct
   vector<const char *> names(_Data->_channels.size());
   for(size_t i=0;i<names.size();i++)
   {
       names[i]=_Data->_channels[i].c_str();
   }
   
   if(!_Data->_zback) names[1]=names[0]; // no zback channel, so make it point to z

   
   
   TaskGroup g;
   for(int y=start;y<=end;y++)
   {
       ThreadPool::addGlobalTask(new LineCompositeTask(&g,_Data,y,start,&names,&pointers,&total_sizes,&num_sources));
   }//next row
}